

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestHarness_cTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_TestHarness_c_checkRealText_TestShell::createTest
          (TEST_TestHarness_c_checkRealText_TestShell *this)

{
  TEST_TestHarness_c_checkRealText_Test *this_00;
  TEST_TestHarness_c_checkRealText_TestShell *this_local;
  
  this_00 = (TEST_TestHarness_c_checkRealText_Test *)
            operator_new(0x10,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestHarness_cTest.cpp"
                         ,0x194);
  TEST_TestHarness_c_checkRealText_Test::TEST_TestHarness_c_checkRealText_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(TestHarness_c, checkRealText)
{
    CHECK_EQUAL_C_REAL_TEXT(1.0, 1.1, 0.5, "Text");
    fixture->setTestFunction(failRealTextMethod_);
    fixture->runAllTests();
    fixture->assertPrintContains("expected <1>\n\tbut was  <2>");
    fixture->assertPrintContains("arness_c");
    fixture->assertPrintContains("Message: RealTestText");
    CHECK(!hasDestructorOfTheDestructorCheckedBeenCalled);
}